

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O0

Value * __thiscall
anon_unknown.dwarf_86fa57::Target::DumpFolder(Value *__return_storage_ptr__,Target *this)

{
  cmGeneratorTarget *this_00;
  char *pcVar1;
  Value *this_01;
  Value local_b0;
  Value local_88;
  allocator<char> local_49;
  string local_48;
  char *local_28;
  char *f;
  Target *local_18;
  Target *this_local;
  Value *folder;
  
  f._7_1_ = 0;
  local_18 = this;
  this_local = (Target *)__return_storage_ptr__;
  Json::Value::Value(__return_storage_ptr__,nullValue);
  this_00 = this->GT;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"FOLDER",&local_49);
  pcVar1 = cmGeneratorTarget::GetProperty(this_00,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  if (pcVar1 != (char *)0x0) {
    local_28 = pcVar1;
    Json::Value::Value(&local_88,objectValue);
    Json::Value::operator=(__return_storage_ptr__,&local_88);
    Json::Value::~Value(&local_88);
    Json::Value::Value(&local_b0,local_28);
    this_01 = Json::Value::operator[](__return_storage_ptr__,"name");
    Json::Value::operator=(this_01,&local_b0);
    Json::Value::~Value(&local_b0);
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value Target::DumpFolder()
{
  Json::Value folder;
  if (const char* f = this->GT->GetProperty("FOLDER")) {
    folder = Json::objectValue;
    folder["name"] = f;
  }
  return folder;
}